

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::UpdateColumn
          (RowGroup *this,TransactionData transaction,DataChunk *updates,Vector *row_ids,
          vector<unsigned_long,_true> *column_path)

{
  data_ptr_t pdVar1;
  storage_t c;
  const_reference pvVar2;
  ColumnData *pCVar3;
  reference pvVar4;
  type other;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> local_38;
  
  pdVar1 = row_ids->data;
  pvVar2 = vector<unsigned_long,_true>::get<true>(column_path,0);
  c = *pvVar2;
  pCVar3 = GetColumn(this,c);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>(&updates->data,0);
  (*pCVar3->_vptr_ColumnData[0x18])
            (pCVar3,column_path,pvVar4,pdVar1,updates->count,1,transaction.transaction.ptr._0_4_,
             (undefined4)transaction.transaction_id,transaction.start_time);
  (*pCVar3->_vptr_ColumnData[0x19])(&local_38,pCVar3);
  other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
          operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                     *)&local_38);
  MergeStatistics(this,c,other);
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr(&local_38);
  return;
}

Assistant:

void RowGroup::UpdateColumn(TransactionData transaction, DataChunk &updates, Vector &row_ids,
                            const vector<column_t> &column_path) {
	D_ASSERT(updates.ColumnCount() == 1);
	auto ids = FlatVector::GetData<row_t>(row_ids);

	auto primary_column_idx = column_path[0];
	D_ASSERT(primary_column_idx != COLUMN_IDENTIFIER_ROW_ID);
	D_ASSERT(primary_column_idx < columns.size());
	auto &col_data = GetColumn(primary_column_idx);
	col_data.UpdateColumn(transaction, column_path, updates.data[0], ids, updates.size(), 1);
	MergeStatistics(primary_column_idx, *col_data.GetUpdateStatistics());
}